

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FluctuatingChargeAtomTypesSectionParser.cpp
# Opt level: O2

void __thiscall
OpenMD::FluctuatingChargeAtomTypesSectionParser::FluctuatingChargeAtomTypesSectionParser
          (FluctuatingChargeAtomTypesSectionParser *this,ForceFieldOptions *options)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::FluctuatingChargeAtomTypesSectionParser::FluctuatingTypeEnum,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::FluctuatingChargeAtomTypesSectionParser::FluctuatingTypeEnum>_>_>
  *this_00;
  _Rb_tree_header *p_Var1;
  mapped_type *pmVar2;
  allocator<char> local_39;
  key_type local_38;
  
  (this->super_SectionParser).sectionName_._M_dataplus._M_p =
       (pointer)&(this->super_SectionParser).sectionName_.field_2;
  (this->super_SectionParser).sectionName_._M_string_length = 0;
  (this->super_SectionParser).sectionName_.field_2._M_local_buf[0] = '\0';
  (this->super_SectionParser)._vptr_SectionParser =
       (_func_int **)&PTR__FluctuatingChargeAtomTypesSectionParser_0021bad8;
  (this->stringToEnumMap_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->stringToEnumMap_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  this_00 = &this->stringToEnumMap_;
  p_Var1 = &(this->stringToEnumMap_)._M_t._M_impl.super__Rb_tree_header;
  (this->stringToEnumMap_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->stringToEnumMap_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->stringToEnumMap_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->options_ = options;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"FluctuatingChargeAtomTypes",&local_39);
  std::__cxx11::string::_M_assign((string *)&(this->super_SectionParser).sectionName_);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"Hardness",&local_39);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::FluctuatingChargeAtomTypesSectionParser::FluctuatingTypeEnum,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::FluctuatingChargeAtomTypesSectionParser::FluctuatingTypeEnum>_>_>
           ::operator[](this_00,&local_38);
  *pmVar2 = fqtHardness;
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"EAM",&local_39);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::FluctuatingChargeAtomTypesSectionParser::FluctuatingTypeEnum,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::FluctuatingChargeAtomTypesSectionParser::FluctuatingTypeEnum>_>_>
           ::operator[](this_00,&local_38);
  *pmVar2 = fqtEAM;
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"EAMPoly",&local_39);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::FluctuatingChargeAtomTypesSectionParser::FluctuatingTypeEnum,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::FluctuatingChargeAtomTypesSectionParser::FluctuatingTypeEnum>_>_>
           ::operator[](this_00,&local_38);
  *pmVar2 = fqtEAMPolynomial;
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"DREAM2",&local_39);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::FluctuatingChargeAtomTypesSectionParser::FluctuatingTypeEnum,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::FluctuatingChargeAtomTypesSectionParser::FluctuatingTypeEnum>_>_>
           ::operator[](this_00,&local_38);
  *pmVar2 = fqtDREAM2;
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

FluctuatingChargeAtomTypesSectionParser::
      FluctuatingChargeAtomTypesSectionParser(ForceFieldOptions& options) :
      options_(options) {
    setSectionName("FluctuatingChargeAtomTypes");

    stringToEnumMap_["Hardness"] = fqtHardness;
    stringToEnumMap_["EAM"]      = fqtEAM;
    stringToEnumMap_["EAMPoly"]  = fqtEAMPolynomial;
    stringToEnumMap_["DREAM2"]   = fqtDREAM2;
  }